

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_f.c
# Opt level: O0

void unpack(char *dirname,char *option)

{
  wchar_t wVar1;
  undefined8 in_RSI;
  char *in_RDI;
  void *in_stack_00000010;
  int r;
  char *in_stack_000003f0;
  char *in_stack_ffffffffffffffd8;
  char *pathname;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  assertion_make_dir((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,L'\0');
  assertion_chdir((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                  in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  extract_reference_file(in_stack_000003f0);
  wVar1 = systemf("%s -i %s < test_option_f.cpio > copy-no-a.out 2>copy-no-a.err",testprog,in_RSI);
  pathname = (char *)0x0;
  assertion_equal_int(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1127ec,in_stack_00000010);
  assertion_chdir((char *)CONCAT44(wVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,
                  pathname);
  return;
}

Assistant:

static void
unpack(const char *dirname, const char *option)
{
	int r;

	assertMakeDir(dirname, 0755);
	assertChdir(dirname);
	extract_reference_file("test_option_f.cpio");
	r = systemf("%s -i %s < test_option_f.cpio > copy-no-a.out 2>copy-no-a.err", testprog, option);
	assertEqualInt(0, r);
	assertChdir("..");
}